

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O0

int raptor_sockaddr_set_port(raptor_resolved_address *resolved_addr,int port)

{
  uint16_t uVar1;
  raptor_sockaddr *addr;
  int port_local;
  raptor_resolved_address *resolved_addr_local;
  
  if ((port < 0) || (0xffff < port)) {
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
               ,0xfb,kLogLevelError,"Invalid port number: %d",(ulong)(uint)port);
    resolved_addr_local._4_4_ = 0;
  }
  else if (*(short *)resolved_addr->addr == 2) {
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)(resolved_addr->addr + 2) = uVar1;
    resolved_addr_local._4_4_ = 1;
  }
  else if (*(short *)resolved_addr->addr == 10) {
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)(resolved_addr->addr + 2) = uVar1;
    resolved_addr_local._4_4_ = 1;
  }
  else {
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
               ,0x109,kLogLevelError,"Unknown socket family %d in raptor_sockaddr_set_port",
               (ulong)*(ushort *)resolved_addr->addr);
    resolved_addr_local._4_4_ = 0;
  }
  return resolved_addr_local._4_4_;
}

Assistant:

int raptor_sockaddr_set_port(
    const raptor_resolved_address* resolved_addr, int port) {
    const raptor_sockaddr* addr =
        reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    if (!(port >= 0 && port < 65536)) {
        log_error("Invalid port number: %d", port);
        return 0;
    }

    switch (addr->sa_family) {
    case AF_INET:
        ((raptor_sockaddr_in*)addr)->sin_port =
            htons(static_cast<uint16_t>(port));
        return 1;
    case AF_INET6:
        ((raptor_sockaddr_in6*)addr)->sin6_port =
            htons(static_cast<uint16_t>(port));
        return 1;
    default:
        log_error("Unknown socket family %d in raptor_sockaddr_set_port", addr->sa_family);
        return 0;
    }
}